

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

BaseState<true> * __thiscall BaseState<true>::Bool(BaseState<true> *this,Context<true> *ctx,bool b)

{
  stringstream *psVar1;
  ostream *poVar2;
  byte in_DL;
  char *pcVar3;
  
  psVar1 = Context<true>::error_abi_cxx11_((Context<true> *)this);
  poVar2 = std::operator<<((ostream *)(psVar1 + 0x10),"Unexpected token: bool (");
  pcVar3 = "false";
  if ((in_DL & 1) != 0) {
    pcVar3 = "true";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::operator<<(poVar2,")");
  return (BaseState<true> *)0x0;
}

Assistant:

virtual BaseState<audit>* Bool(Context<audit>& ctx, bool b)
  {
    ctx.error() << "Unexpected token: bool (" << (b ? "true" : "false") << ")";
    return nullptr;
  }